

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxInCountByHandle(void *handle,void *tx_data_handle,uint32_t *count)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfidentialTransaction *this;
  uint32_t uVar2;
  CfdException *this_00;
  bool is_bitcoin;
  bool local_51;
  string local_50;
  
  cfd::Initialize();
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_51 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_51);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (local_51 == true) {
      if (count == (uint32_t *)0x0) {
        return 0;
      }
      uVar2 = cfd::core::Transaction::GetTxInCount((Transaction *)this);
    }
    else {
      if (count == (uint32_t *)0x0) {
        return 0;
      }
      uVar2 = cfd::core::ConfidentialTransaction::GetTxInCount(this);
    }
    *count = uVar2;
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_50);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInCountByHandle(
    void* handle, void* tx_data_handle, uint32_t* count) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (count != nullptr) *count = tx->GetTxInCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (count != nullptr) *count = tx->GetTxInCount();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}